

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::load_flattened_struct
          (string *__return_storage_ptr__,CompilerGLSL *this,string *basename,SPIRType *type)

{
  uint uVar1;
  uint32_t id;
  size_t sVar2;
  TypedID *this_00;
  string local_a8;
  string local_88;
  string local_68;
  SPIRType *local_48;
  SPIRType *member_type;
  uint32_t i;
  undefined1 local_29;
  SPIRType *local_28;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  string *expr;
  
  local_29 = 0;
  local_28 = type;
  type_local = (SPIRType *)basename;
  basename_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
  for (member_type._0_4_ = 0; uVar1 = (uint)member_type,
      sVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(local_28->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
      uVar1 < (uint)sVar2; member_type._0_4_ = (uint)member_type + 1) {
    if ((uint)member_type != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(local_28->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)member_type);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    local_48 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    if (local_48->basetype == Struct) {
      to_flattened_struct_member(&local_88,this,(string *)type_local,local_28,(uint)member_type);
      load_flattened_struct(&local_68,this,&local_88,local_48);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      to_flattened_struct_member(&local_a8,this,(string *)type_local,local_28,(uint)member_type);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::load_flattened_struct(const string &basename, const SPIRType &type)
{
	auto expr = type_to_glsl_constructor(type);
	expr += '(';

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		if (i)
			expr += ", ";

		auto &member_type = get<SPIRType>(type.member_types[i]);
		if (member_type.basetype == SPIRType::Struct)
			expr += load_flattened_struct(to_flattened_struct_member(basename, type, i), member_type);
		else
			expr += to_flattened_struct_member(basename, type, i);
	}
	expr += ')';
	return expr;
}